

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O3

void test_comments_5(void)

{
  run("\"\\r\\n\" should be considered a newline for standalone tags",
      "|\r\n{{! Standalone Comment }}\r\n|","{}",(char *)0x0,"|\r\n|");
  return;
}

Assistant:

static void
test_comments_5(void)
{
    run(
        "\"\\r\\n\" should be considered a newline for standalone tags",
        "|\r\n{{! Standalone Comment }}\r\n|",
        "{}",
        NULL,
        "|\r\n|"
    );
}